

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::Array<capnp::_::RawBrandedSchema::Scope>::~Array(Array<capnp::_::RawBrandedSchema::Scope> *this)

{
  dispose(this);
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }